

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::MLABecLaplacian
          (MLABecLaplacian *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_ncomp)

{
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_RDI;
  int in_R9D;
  pointer pGVar1;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffff9c;
  MLCellABecLap *in_stack_ffffffffffffffa0;
  LPInfo *a_info_00;
  pointer *a_dmap_00;
  pointer *a_grids_00;
  MLABecLaplacian *in_stack_ffffffffffffffc0;
  
  MLCellABecLap::MLCellABecLap(in_stack_ffffffffffffffa0);
  (in_RDI->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__MLABecLaplacian_01aa5998;
  *(undefined1 *)
   &in_RDI[0x21].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  pGVar1 = (pointer)std::numeric_limits<double>::quiet_NaN();
  in_RDI[0x21].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pGVar1;
  pGVar1 = (pointer)std::numeric_limits<double>::quiet_NaN();
  in_RDI[0x22].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = pGVar1;
  a_info_00 = (LPInfo *)
              &in_RDI[0x22].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::Vector((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            *)0x154f480);
  a_dmap_00 = &in_RDI[0x23].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::Vector((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)0x154f496);
  a_grids_00 = &in_RDI[0x24].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                super__Vector_impl_data._M_finish;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x154f4ac);
  *(undefined4 *)
   &in_RDI[0x25].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  define(in_stack_ffffffffffffffc0,in_RDI,
         (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)a_grids_00,
         (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
         a_dmap_00,a_info_00,
         (Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_00000008),in_R9D);
  return;
}

Assistant:

MLABecLaplacian::MLABecLaplacian (const Vector<Geometry>& a_geom,
                                  const Vector<BoxArray>& a_grids,
                                  const Vector<DistributionMapping>& a_dmap,
                                  const LPInfo& a_info,
                                  const Vector<FabFactory<FArrayBox> const*>& a_factory,
                                  const int a_ncomp)
{
    define(a_geom, a_grids, a_dmap, a_info, a_factory, a_ncomp);
}